

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::link_compute_shader(NegativeTestContext *ctx)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  long lVar4;
  allocator<char> local_65;
  GLint linkStatus;
  char *otherShaderSource;
  char *computeShaderSource;
  string local_50;
  
  computeShaderSource = "#version 320 es\nvoid main (void)\n{\n}\n";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Compute Shader linked with shader of other kind.",
             (allocator<char> *)&otherShaderSource);
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
    linkStatus = -1;
    GVar1 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
    GVar2 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x91b9);
    GVar3 = glu::CallLogWrapper::glCreateShader
                      (&ctx->super_CallLogWrapper,*(GLenum *)((long)&DAT_018c84e0 + lVar4));
    otherShaderSource = "#version 320 es\nlayout(max_vertices = 3) out;\nvoid main(void){}\n";
    if (lVar4 != 8) {
      otherShaderSource = computeShaderSource;
    }
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,GVar2,1,&computeShaderSource,(GLint *)0x0);
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,GVar3,1,&otherShaderSource,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar3);
    glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar2);
    glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar3);
    glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,GVar1,0x8b82,&linkStatus);
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar3);
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,GVar1);
    if (linkStatus != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Program should not have linked",&local_65);
      NegativeTestContext::fail(ctx,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  NegativeTestContext::endSection(ctx);
  otherShaderSource = "#version 310 es\nvoid main (void)\n{\n}\n";
  linkStatus = -1;
  GVar1 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  GVar2 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x91b9);
  GVar3 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,GVar2,1,&computeShaderSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,GVar3,1,&otherShaderSource,(GLint *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "Compute Shader should not be linked with shaders of different version.",&local_65);
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar2);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,GVar3);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar2);
  glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,GVar1,GVar3);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,GVar1);
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,GVar1,0x8b82,&linkStatus);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar3);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar2);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,GVar1);
  if (linkStatus != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Program should not have linked",&local_65);
    NegativeTestContext::fail(ctx,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void link_compute_shader (NegativeTestContext& ctx)
{
	const char* computeShaderSource		=	"#version 320 es\n"
											"void main (void)\n"
											"{\n"
											"}\n\0";
	{
		const GLenum shaderTypes[]			=	{
													GL_VERTEX_SHADER,
													GL_FRAGMENT_SHADER,
													GL_GEOMETRY_SHADER,
													GL_TESS_CONTROL_SHADER,
													GL_TESS_EVALUATION_SHADER
												};

		ctx.beginSection("Compute Shader linked with shader of other kind.");
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ndx++)
		{
			GLint linkStatus				=	-1;
			GLuint program					=	ctx.glCreateProgram();
			GLuint computeShader			=	ctx.glCreateShader(GL_COMPUTE_SHADER);
			GLuint otherShader				=	ctx.glCreateShader(shaderTypes[ndx]);
			const char* otherShaderSource	=	(shaderTypes[ndx] != GL_GEOMETRY_SHADER)	?
												computeShaderSource							:
												"#version 320 es\n"
												"layout(max_vertices = 3) out;\n"
												"void main(void){}\n\0";

			ctx.glShaderSource(computeShader, 1, &computeShaderSource, DE_NULL);
			ctx.glShaderSource(otherShader, 1, &otherShaderSource, DE_NULL);
			ctx.glCompileShader(computeShader);
			ctx.glCompileShader(otherShader);
			ctx.glAttachShader(program, computeShader);
			ctx.glAttachShader(program, otherShader);
			ctx.glLinkProgram(program);
			ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
			ctx.glDeleteShader(otherShader);
			ctx.glDeleteShader(computeShader);
			ctx.glDeleteProgram(program);
			if (linkStatus != GL_FALSE)
				ctx.fail("Program should not have linked");
		}
		ctx.endSection();
	}
	{
		const char* computeShaderSource310	=	"#version 310 es\n"
												"void main (void)\n"
												"{\n"
												"}\n\0";
		GLint linkStatus					=	-1;
		GLuint program						=	ctx.glCreateProgram();
		GLuint computeShader				=	ctx.glCreateShader(GL_COMPUTE_SHADER);
		GLuint computeShader310				=	ctx.glCreateShader(GL_FRAGMENT_SHADER);

		ctx.glShaderSource(computeShader, 1, &computeShaderSource, DE_NULL);
		ctx.glShaderSource(computeShader310, 1, &computeShaderSource310, DE_NULL);
		ctx.beginSection("Compute Shader should not be linked with shaders of different version.");
		ctx.glCompileShader(computeShader);
		ctx.glCompileShader(computeShader310);
		ctx.glAttachShader(program, computeShader);
		ctx.glAttachShader(program, computeShader310);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
		ctx.glDeleteShader(computeShader310);
		ctx.glDeleteShader(computeShader);
		ctx.glDeleteProgram(program);
		if (linkStatus != GL_FALSE)
			ctx.fail("Program should not have linked");
		ctx.endSection();
	}
}